

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O3

void load_GL_NV_draw_vulkan_image(GLADloadproc load)

{
  if (GLAD_GL_NV_draw_vulkan_image != 0) {
    glad_glDrawVkImageNV = (PFNGLDRAWVKIMAGENVPROC)(*load)("glDrawVkImageNV");
    glad_glGetVkProcAddrNV = (PFNGLGETVKPROCADDRNVPROC)(*load)("glGetVkProcAddrNV");
    glad_glWaitVkSemaphoreNV = (PFNGLWAITVKSEMAPHORENVPROC)(*load)("glWaitVkSemaphoreNV");
    glad_glSignalVkSemaphoreNV = (PFNGLSIGNALVKSEMAPHORENVPROC)(*load)("glSignalVkSemaphoreNV");
    glad_glSignalVkFenceNV = (PFNGLSIGNALVKFENCENVPROC)(*load)("glSignalVkFenceNV");
  }
  return;
}

Assistant:

static void load_GL_NV_draw_vulkan_image(GLADloadproc load) {
	if(!GLAD_GL_NV_draw_vulkan_image) return;
	glad_glDrawVkImageNV = (PFNGLDRAWVKIMAGENVPROC)load("glDrawVkImageNV");
	glad_glGetVkProcAddrNV = (PFNGLGETVKPROCADDRNVPROC)load("glGetVkProcAddrNV");
	glad_glWaitVkSemaphoreNV = (PFNGLWAITVKSEMAPHORENVPROC)load("glWaitVkSemaphoreNV");
	glad_glSignalVkSemaphoreNV = (PFNGLSIGNALVKSEMAPHORENVPROC)load("glSignalVkSemaphoreNV");
	glad_glSignalVkFenceNV = (PFNGLSIGNALVKFENCENVPROC)load("glSignalVkFenceNV");
}